

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_qr(REF_INT m,REF_INT n,REF_DBL *a,REF_DBL *q,REF_DBL *r)

{
  int iVar1;
  double dVar2;
  double local_58;
  double local_48;
  int local_3c;
  int local_38;
  REF_INT k;
  REF_INT j;
  REF_INT i;
  REF_DBL *r_local;
  REF_DBL *q_local;
  REF_DBL *a_local;
  REF_INT n_local;
  REF_INT m_local;
  
  for (local_38 = 0; local_38 < n; local_38 = local_38 + 1) {
    for (k = 0; k < m; k = k + 1) {
      q[k + m * local_38] = a[k + m * local_38];
    }
  }
  for (local_38 = 0; local_38 < n; local_38 = local_38 + 1) {
    for (k = 0; k < n; k = k + 1) {
      r[k + n * local_38] = 0.0;
    }
  }
  local_3c = 0;
  do {
    if (n <= local_3c) {
      return 0;
    }
    for (k = 0; k < m; k = k + 1) {
      iVar1 = local_3c + n * local_3c;
      r[iVar1] = q[k + m * local_3c] * q[k + m * local_3c] + r[iVar1];
    }
    dVar2 = sqrt(r[local_3c + n * local_3c]);
    r[local_3c + n * local_3c] = dVar2;
    for (k = 0; local_38 = local_3c, k < m; k = k + 1) {
      if (r[local_3c + n * local_3c] * 1e+20 <= 0.0) {
        local_48 = -(r[local_3c + n * local_3c] * 1e+20);
      }
      else {
        local_48 = r[local_3c + n * local_3c] * 1e+20;
      }
      if (q[k + m * local_3c] <= 0.0) {
        local_58 = -q[k + m * local_3c];
      }
      else {
        local_58 = q[k + m * local_3c];
      }
      if (local_48 <= local_58) {
        return 4;
      }
      iVar1 = k + m * local_3c;
      q[iVar1] = q[iVar1] / r[local_3c + n * local_3c];
    }
    while (local_38 = local_38 + 1, local_38 < n) {
      for (k = 0; k < m; k = k + 1) {
        iVar1 = local_3c + n * local_38;
        r[iVar1] = a[k + m * local_38] * q[k + m * local_3c] + r[iVar1];
      }
      for (k = 0; k < m; k = k + 1) {
        iVar1 = k + m * local_38;
        q[iVar1] = -r[local_3c + n * local_38] * q[k + m * local_3c] + q[iVar1];
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_matrix_qr(REF_INT m, REF_INT n, REF_DBL *a, REF_DBL *q,
                                 REF_DBL *r) {
  REF_INT i, j, k;

  for (j = 0; j < n; j++)
    for (i = 0; i < m; i++) q[i + m * j] = a[i + m * j];

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) r[i + n * j] = 0.0;

  for (k = 0; k < n; k++) {
    for (i = 0; i < m; i++) r[k + n * k] += q[i + m * k] * q[i + m * k];
    r[k + n * k] = sqrt(r[k + n * k]);
    for (i = 0; i < m; i++) {
      if (!ref_math_divisible(q[i + m * k], r[k + n * k])) {
        return REF_DIV_ZERO;
      }
      q[i + m * k] /= r[k + n * k];
    }
    for (j = k + 1; j < n; j++) {
      for (i = 0; i < m; i++) r[k + n * j] += a[i + m * j] * q[i + m * k];
      for (i = 0; i < m; i++) q[i + m * j] -= r[k + n * j] * q[i + m * k];
    }
  }

  return REF_SUCCESS;
}